

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ClockingSkewSyntax *node;
  ClockingDirectionSyntax *pCVar1;
  Info *args_3;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  ClockingSkewSyntax *in_stack_ffffffffffffffb0;
  ClockingSkewSyntax *args_2;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  if (*(long *)(__fn + 0x28) == 0) {
    node = (ClockingSkewSyntax *)0x0;
  }
  else {
    node = deepClone<slang::syntax::ClockingSkewSyntax>
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  args_2 = node;
  TVar3 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  args_3 = TVar3.info;
  if (*(long *)(__fn + 0x40) != 0) {
    deepClone<slang::syntax::ClockingSkewSyntax>(node,in_stack_ffffffffffffffa8);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingDirectionSyntax,slang::parsing::Token,slang::syntax::ClockingSkewSyntax*,slang::parsing::Token,slang::syntax::ClockingSkewSyntax*>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,(Token *)args_2
                      ,(ClockingSkewSyntax **)args_3);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingDirectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingDirectionSyntax>(
        node.input.deepClone(alloc),
        node.inputSkew ? deepClone(*node.inputSkew, alloc) : nullptr,
        node.output.deepClone(alloc),
        node.outputSkew ? deepClone(*node.outputSkew, alloc) : nullptr
    );
}